

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::cni_helper<void_(*)(bool),_void_(*)(bool)>::_call<0>
          (cni_helper<void_(*)(bool),_void_(*)(bool)> *this,vector *args,sequence<0> *param_3)

{
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  function<void_(bool)> *in_RDI;
  var *in_stack_000000f0;
  undefined1 in_stack_ffffffffffffffdf;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
  try_convert_and_check<bool,_bool,_bool,_0UL>::convert(in_stack_000000f0);
  std::function<void_(bool)>::operator()(in_RDI,(bool)in_stack_ffffffffffffffdf);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}